

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseRegisterTable
          (MipsParser *this,Parser *parser,MipsRegisterValue *dest,MipsRegisterDescriptor *table,
          size_t count)

{
  size_t this_00;
  bool bVar1;
  Token *pTVar2;
  int num;
  string_view local_68;
  ulong local_58;
  size_t i;
  Identifier *identifier;
  Token *token;
  bool hasDollar;
  size_t sStack_38;
  int offset;
  size_t count_local;
  MipsRegisterDescriptor *table_local;
  MipsRegisterValue *dest_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  token._4_4_ = 0;
  sStack_38 = count;
  count_local = (size_t)table;
  table_local = (MipsRegisterDescriptor *)dest;
  dest_local = (MipsRegisterValue *)parser;
  parser_local = (Parser *)this;
  pTVar2 = Parser::peekToken(parser,0);
  token._3_1_ = pTVar2->type == Dollar;
  if ((bool)token._3_1_) {
    token._4_4_ = 1;
  }
  identifier = (Identifier *)Parser::peekToken((Parser *)dest_local,token._4_4_);
  if (((Token *)identifier)->type == Identifier) {
    i = (size_t)Token::identifierValue((Token *)identifier);
    for (local_58 = 0; this_00 = i, local_58 < sStack_38; local_58 = local_58 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_68,*(char **)(count_local + local_58 * 0x10));
      bVar1 = Identifier::operator==((Identifier *)this_00,local_68);
      if (bVar1) {
        Identifier::operator=((Identifier *)&table_local->num,(Identifier *)i);
        table_local[2].num = *(int *)(count_local + local_58 * 0x10 + 8);
        num = 1;
        if ((token._3_1_ & 1) != 0) {
          num = 2;
        }
        Parser::eatTokens((Parser *)dest_local,num);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool MipsParser::parseRegisterTable(Parser& parser, MipsRegisterValue& dest, const MipsRegisterDescriptor* table, size_t count)
{
	int offset = 0;
	bool hasDollar = parser.peekToken().type == TokenType::Dollar;
	if (hasDollar)
		offset = 1;

	const Token &token = parser.peekToken(offset);

	if (token.type != TokenType::Identifier)
		return false;

	const auto &identifier = token.identifierValue();
	for (size_t i = 0; i < count; i++)
	{
		if (identifier == table[i].name)
		{
			dest.name = identifier;
			dest.num = table[i].num;
			parser.eatTokens(hasDollar ? 2 : 1);
			return true;
		}
	}

	return false;
}